

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

QSize __thiscall QAbstractScrollArea::sizeHint(QAbstractScrollArea *this)

{
  long lVar1;
  bool bVar2;
  QAbstractScrollAreaPrivate *pQVar3;
  QSize QVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool hbarHidden;
  bool vbarHidden;
  int f;
  QAbstractScrollAreaPrivate *d;
  QSize scrollbars;
  QSize frame;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  QSize *in_stack_ffffffffffffff80;
  int iVar5;
  undefined4 in_stack_ffffffffffffff90;
  int iVar6;
  int iVar7;
  undefined2 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff96;
  bool bVar8;
  undefined1 uVar9;
  undefined1 in_stack_ffffffffffffff97;
  bool bVar10;
  undefined1 uVar11;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QAbstractScrollArea *)0x499940);
  if (pQVar3->sizeAdjustPolicy == AdjustIgnored) {
    QSize::QSize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  }
  else {
    bVar2 = QSize::isValid((QSize *)CONCAT17(in_stack_ffffffffffffff97,
                                             CONCAT16(in_stack_ffffffffffffff96,
                                                      CONCAT24(in_stack_ffffffffffffff94,
                                                               in_stack_ffffffffffffff90))));
    if ((!bVar2) || (pQVar3->sizeAdjustPolicy == AdjustToContents)) {
      QSize::QSize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      bVar2 = QWidget::isVisibleTo
                        (in_RDI,(QWidget *)
                                CONCAT17(in_stack_ffffffffffffff97,
                                         CONCAT16(in_stack_ffffffffffffff96,
                                                  CONCAT24(in_stack_ffffffffffffff94,
                                                           in_stack_ffffffffffffff90))));
      bVar10 = true;
      if (bVar2) {
        bVar10 = pQVar3->vbarpolicy == ScrollBarAlwaysOff;
      }
      uVar11 = bVar10;
      bVar2 = QWidget::isVisibleTo
                        (in_RDI,(QWidget *)
                                CONCAT17(bVar10,CONCAT16(in_stack_ffffffffffffff96,
                                                         CONCAT24(in_stack_ffffffffffffff94,
                                                                  in_stack_ffffffffffffff90))));
      bVar8 = true;
      if (bVar2) {
        bVar8 = pQVar3->hbarpolicy == ScrollBarAlwaysOff;
      }
      uVar9 = bVar8;
      if (bVar10 == false) {
        (**(code **)(*(long *)&(pQVar3->vbar->super_QAbstractSlider).super_QWidget + 0x70))();
        iVar6 = QSize::width((QSize *)0x499a85);
      }
      else {
        iVar6 = 0;
      }
      iVar7 = iVar6;
      if (bVar8 == false) {
        (**(code **)(*(long *)&(pQVar3->hbar->super_QAbstractSlider).super_QWidget + 0x70))();
        iVar5 = QSize::height((QSize *)0x499ac1);
      }
      else {
        iVar5 = 0;
      }
      QSize::QSize(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      ::operator+((QSize *)CONCAT17(uVar11,CONCAT16(uVar9,CONCAT24(in_stack_ffffffffffffff94,iVar7))
                                   ),(QSize *)CONCAT44(iVar6,iVar5));
      (**(code **)(*(long *)in_RDI + 0x1c0))();
      QVar4 = ::operator+((QSize *)CONCAT17(uVar11,CONCAT16(uVar9,CONCAT24(in_stack_ffffffffffffff94
                                                                           ,iVar7))),
                          (QSize *)CONCAT44(iVar6,iVar5));
      pQVar3->sizeHint = QVar4;
    }
    local_10 = pQVar3->sizeHint;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QAbstractScrollArea::sizeHint() const
{
    Q_D(const QAbstractScrollArea);
    if (d->sizeAdjustPolicy == QAbstractScrollArea::AdjustIgnored)
        return QSize(256, 192);

    if (!d->sizeHint.isValid() || d->sizeAdjustPolicy == QAbstractScrollArea::AdjustToContents) {
        const int f = 2 * d->frameWidth;
        const QSize frame(f, f);
        const bool vbarHidden = !d->vbar->isVisibleTo(this) || d->vbarpolicy == Qt::ScrollBarAlwaysOff;
        const bool hbarHidden = !d->hbar->isVisibleTo(this) || d->hbarpolicy == Qt::ScrollBarAlwaysOff;
        const QSize scrollbars(vbarHidden ? 0 : d->vbar->sizeHint().width(),
                               hbarHidden ? 0 : d->hbar->sizeHint().height());
        d->sizeHint = frame + scrollbars + viewportSizeHint();
    }
    return d->sizeHint;
}